

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.cc
# Opt level: O0

void __thiscall prometheus::Histogram::Observe(Histogram *this,double value)

{
  iterator __first;
  iterator __first_00;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __last;
  size_type __n;
  reference this_00;
  lock_guard<std::mutex> local_48;
  lock_guard<std::mutex> lock;
  size_t bucket_index;
  double value_local;
  Histogram *this_local;
  
  bucket_index = (size_t)value;
  value_local = (double)this;
  __first = std::vector<double,_std::allocator<double>_>::begin(&this->bucket_boundaries_);
  __first_00 = std::vector<double,_std::allocator<double>_>::begin(&this->bucket_boundaries_);
  lock._M_device =
       (mutex_type *)std::vector<double,_std::allocator<double>_>::end(&this->bucket_boundaries_);
  __last = std::
           lower_bound<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
                     (__first_00._M_current,
                      (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                      lock._M_device,(double *)&bucket_index);
  __n = std::
        distance<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                  ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                   __first._M_current,__last);
  std::lock_guard<std::mutex>::lock_guard(&local_48,&this->mutex_);
  Gauge::Increment(&this->sum_,(double)bucket_index);
  this_00 = std::vector<prometheus::Counter,_std::allocator<prometheus::Counter>_>::operator[]
                      (&this->bucket_counts_,__n);
  Counter::Increment(this_00);
  std::lock_guard<std::mutex>::~lock_guard(&local_48);
  return;
}

Assistant:

void Histogram::Observe(const double value) {
  const auto bucket_index = static_cast<std::size_t>(
      std::distance(bucket_boundaries_.begin(),
                    std::lower_bound(bucket_boundaries_.begin(),
                                     bucket_boundaries_.end(), value)));

  std::lock_guard<std::mutex> lock(mutex_);
  sum_.Increment(value);
  bucket_counts_[bucket_index].Increment();
}